

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O3

void __thiscall Js::AsmJsFunctionCompilation::CleanUp(AsmJsFunctionCompilation *this)

{
  FunctionBody *this_00;
  AsmJSByteCodeGenerator *pAVar1;
  
  pAVar1 = this->mGenerator;
  if ((pAVar1 != (AsmJSByteCodeGenerator *)0x0) && (pAVar1->mInfo != (FuncInfo *)0x0)) {
    this_00 = pAVar1->mFunction->mFuncBody;
    if (this_00 != (FunctionBody *)0x0) {
      FunctionBody::ResetByteCodeGenState(this_00);
      pAVar1 = this->mGenerator;
    }
    ByteCodeWriter::Reset(&(pAVar1->mWriter).super_ByteCodeWriter);
    return;
  }
  return;
}

Assistant:

void AsmJsFunctionCompilation::CleanUp()
    {
        if( mGenerator && mGenerator->mInfo )
        {
            FunctionBody* body = mGenerator->mFunction->GetFuncBody();
            if( body )
            {
                body->ResetByteCodeGenState();
            }
            mGenerator->mWriter.Reset();
        }
    }